

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_component.cpp
# Opt level: O0

void __thiscall lsim::SimComponent::apply_initial_values(SimComponent *this)

{
  Simulator *pSVar1;
  bool bVar2;
  Value value;
  ComponentType CVar3;
  reference pvVar4;
  reference pvVar5;
  ulong local_28;
  size_t pin_1;
  size_t pin;
  Value initial_out;
  SimComponent *this_local;
  
  value = ModelComponent::property_value(this->m_comp_desc,"initial_output",VALUE_UNDEFINED);
  if (value != VALUE_UNDEFINED) {
    for (pin_1 = (size_t)this->m_output_start; pin_1 < this->m_control_start; pin_1 = pin_1 + 1) {
      pSVar1 = this->m_sim;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_pins,pin_1);
      Simulator::pin_set_initial_value(pSVar1,*pvVar4,value);
    }
  }
  CVar3 = ModelComponent::type(this->m_comp_desc);
  if (((CVar3 == 1) &&
      (bVar2 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::empty(&this->m_user_values),
      !bVar2)) &&
     (bVar2 = ModelComponent::property_value(this->m_comp_desc,"tri_state",false), !bVar2)) {
    for (local_28 = (ulong)this->m_output_start; local_28 < this->m_control_start;
        local_28 = local_28 + 1) {
      pvVar5 = std::vector<lsim::Value,_std::allocator<lsim::Value>_>::operator[]
                         (&this->m_user_values,local_28);
      *pvVar5 = VALUE_FALSE;
      pSVar1 = this->m_sim;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_pins,local_28);
      Simulator::pin_set_initial_value(pSVar1,*pvVar4,value);
    }
  }
  return;
}

Assistant:

void SimComponent::apply_initial_values() {
	auto initial_out = m_comp_desc->property_value("initial_output", VALUE_UNDEFINED);
	if (initial_out != VALUE_UNDEFINED) {
		for (size_t pin = m_output_start; pin < m_control_start; ++pin) {
			m_sim->pin_set_initial_value(m_pins[pin], initial_out);
		}
	}

	if (m_comp_desc->type() == COMPONENT_CONNECTOR_IN &&
		!m_user_values.empty() &&
		!m_comp_desc->property_value("tri_state", false)) {
		for (size_t pin = m_output_start; pin < m_control_start; ++pin) {
			m_user_values[pin] = VALUE_FALSE;
			m_sim->pin_set_initial_value(m_pins[pin], initial_out);
		}
	}
}